

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBase.hpp
# Opt level: O3

void __thiscall
Diligent::BufferBase<Diligent::EngineVkImplTraits>::DvpVerifyFlushMappedRangeArguments
          (BufferBase<Diligent::EngineVkImplTraits> *this,Uint64 StartOffset,Uint64 Size)

{
  long lVar1;
  string msg;
  string local_40;
  
  if ((this->m_MemoryProperties & MEMORY_PROPERTY_HOST_COHERENT) != MEMORY_PROPERTY_UNKNOWN) {
    FormatString<char[45]>(&local_40,(char (*) [45])"Coherent memory does not need to be flushed.");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DvpVerifyFlushMappedRangeArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x101);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  lVar1 = (**(code **)((long)(this->
                             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             ).super_ObjectBase<Diligent::IBufferVk>.
                             super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
                             super_IBuffer.super_IDeviceObject.super_IObject + 0x20))(this);
  if (*(char *)(lVar1 + 0x14) == '\x02') {
    FormatString<char[52]>
              (&local_40,(char (*) [52])"Dynamic buffer mapped memory must never be flushed.");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DvpVerifyFlushMappedRangeArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x102);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  lVar1 = (**(code **)((long)(this->
                             super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             ).super_ObjectBase<Diligent::IBufferVk>.
                             super_RefCountedObject<Diligent::IBufferVk>.super_IBufferVk.
                             super_IBuffer.super_IDeviceObject.super_IObject + 0x20))(this);
  if (*(ulong *)(lVar1 + 8) < Size + StartOffset) {
    FormatString<char[38]>(&local_40,(char (*) [38])"Memory range is out of buffer bounds.");
    DebugAssertionFailed
              (local_40._M_dataplus._M_p,"DvpVerifyFlushMappedRangeArguments",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/BufferBase.hpp"
               ,0x103);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void DvpVerifyFlushMappedRangeArguments(Uint64 StartOffset,
                                            Uint64 Size) const
    {
#ifdef DILIGENT_DEVELOPMENT
        DEV_CHECK_ERR((GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0, "Coherent memory does not need to be flushed.");
        DEV_CHECK_ERR(this->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffer mapped memory must never be flushed.");
        DEV_CHECK_ERR(StartOffset + Size <= this->GetDesc().Size, "Memory range is out of buffer bounds.");
#endif
    }